

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_set_column.h
# Opt level: O2

Entry * __thiscall
Gudhi::persistence_matrix::
Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
::_insert_entry(Intrusive_set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
                *this,Field_element *value,ID_index rowIndex,iterator *position)

{
  Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
  *entry;
  ID_index local_3c [3];
  rbtree_node<void_*> *local_30;
  
  local_3c[0] = rowIndex;
  entry = New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>
          ::construct<unsigned_int&,unsigned_int&>
                    ((New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,true,true>>>>
                      *)this->entryPool_,(uint *)this,local_3c);
  (entry->super_Entry_field_element_option).element_ = *value;
  local_30 = (position->members_).nodeptr_;
  boost::intrusive::
  set_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_void>
  ::insert((set_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_void>
            *)(local_3c + 1),(const_iterator *)&this->column_,(reference)&local_30);
  Row_access<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_true>_>_>
  ::insert_entry(&this->super_Row_access_option,local_3c[0],entry);
  return entry;
}

Assistant:

inline typename Intrusive_set_column<Master_matrix>::Entry* Intrusive_set_column<Master_matrix>::_insert_entry(
    const Field_element& value,
    ID_index rowIndex,
    const iterator& position)
{
  if constexpr (Master_matrix::Option_list::has_row_access) {
    Entry* newEntry = entryPool_->construct(RA_opt::columnIndex_, rowIndex);
    newEntry->set_element(value);
    column_.insert(position, *newEntry);
    RA_opt::insert_entry(rowIndex, newEntry);
    return newEntry;
  } else {
    Entry* newEntry = entryPool_->construct(rowIndex);
    newEntry->set_element(value);
    column_.insert(position, *newEntry);
    return newEntry;
  }
}